

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateClearingCode
          (StringFieldGenerator *this,Printer *printer)

{
  char *text;
  char *pcVar1;
  bool bVar2;
  
  bVar2 = *(long *)(*(long *)(this->descriptor_ + 0xa0) + 8) == 0;
  pcVar1 = "$name$_.ClearToDefault($default_variable$, GetArenaNoVirtual());\n";
  if (bVar2) {
    pcVar1 = "$name$_.ClearToEmpty($default_variable$, GetArenaNoVirtual());\n";
  }
  text = "$name$_.ClearToDefaultNoArena($default_variable$);\n";
  if (bVar2) {
    text = "$name$_.ClearToEmptyNoArena($default_variable$);\n";
  }
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7) != '\0') {
    text = pcVar1;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void StringFieldGenerator::
GenerateClearingCode(io::Printer* printer) const {
  // Two-dimension specialization here: supporting arenas or not, and default
  // value is the empty string or not. Complexity here ensures the minimal
  // number of branches / amount of extraneous code at runtime (given that the
  // below methods are inlined one-liners)!
  if (SupportsArenas(descriptor_)) {
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "$name$_.ClearToEmpty($default_variable$, GetArenaNoVirtual());\n");
    } else {
      printer->Print(variables_,
        "$name$_.ClearToDefault($default_variable$, GetArenaNoVirtual());\n");
    }
  } else {
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "$name$_.ClearToEmptyNoArena($default_variable$);\n");
    } else {
      printer->Print(variables_,
        "$name$_.ClearToDefaultNoArena($default_variable$);\n");
    }
  }
}